

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::Add
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *propertyRecord,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  Type *pTVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar4;
  PropertyRecord *key;
  bool bVar5;
  PropertyId propertyId;
  undefined4 *puVar6;
  undefined7 in_register_00000011;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_50;
  DictionaryPropertyDescriptor<unsigned_short> local_48;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  
  propertyRecord_local._4_4_ = (uint)CONCAT71(in_register_00000011,attributes);
  local_40 = propertyRecord;
  if (0xfffe < (this->super_DynamicTypeHandler).slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17e,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar5) goto LAB_00db4da1;
    *puVar6 = 0;
  }
  if ((this->super_DynamicTypeHandler).slotCapacity <= (int)(uint)this->nextPropertyIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17f,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar5) goto LAB_00db4da1;
    *puVar6 = 0;
  }
  local_48.Data = this->nextPropertyIndex;
  if (local_48.Data == 0xffff) {
    ::Math::DefaultOverflowPolicy();
  }
  this->nextPropertyIndex = local_48.Data + 1;
  local_48.flags = PreventFalseReference;
  local_48.Attributes = (PropertyAttributes)propertyRecord_local._4_4_;
  local_48.Getter = 0xffff;
  local_48.Setter = 0xffff;
  if ((isFixed || usedAsFixed) &&
     (((uint)local_40->pid < 0x10 ||
      ((this->singletonInstance).ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x184,
                                "((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr))"
                                ,
                                "(!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr)"
                               );
    if (!bVar5) {
LAB_00db4da1:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  local_48.flags =
       usedAsFixed << 6 | isFixed << 5 | isInitialized << 3 |
       local_48.flags & ~(UsedAsFixed|IsFixed|IsInitialized);
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_40,&local_48);
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_50);
  local_50 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
             &pJVar2->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
  key = local_40;
  pPVar4 = local_50;
  if ((propertyRecord_local._4_4_ & 4) == 0) {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,key);
      ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar4);
    }
  }
  pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_50);
  local_50 = &pJVar2->typesWithNoSpecialPropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
  pPVar4 = local_50;
  bVar5 = NoSpecialPropertyCache::IsSpecialProperty(local_40);
  if ((bVar5) &&
     (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar4);
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Add(
        const PropertyRecord* propertyRecord,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready
        T index = ::Math::PostInc(nextPropertyIndex);

        DictionaryPropertyDescriptor<T> descriptor(index, attributes);
#if ENABLE_FIXED_FIELDS
        Assert((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr));
        descriptor.SetIsInitialized(isInitialized);
        descriptor.SetIsFixed(isFixed);
        descriptor.SetUsedAsFixed(usedAsFixed);
#endif
        propertyMap->Add(propertyRecord, descriptor);

        scriptContext->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
        scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
    }